

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

SmallVector<unsigned_int,_2UL> * __thiscall
spvtools::utils::SmallVector<unsigned_int,_2UL>::operator=
          (SmallVector<unsigned_int,_2UL> *this,SmallVector<unsigned_int,_2UL> *that)

{
  bool bVar1;
  type this_00;
  type pvVar2;
  ulong local_28;
  size_t i;
  SmallVector<unsigned_int,_2UL> *local_18;
  SmallVector<unsigned_int,_2UL> *that_local;
  SmallVector<unsigned_int,_2UL> *this_local;
  
  local_18 = that;
  that_local = this;
  if (this->small_data_ == (uint *)0x0) {
    __assert_fail("small_data_",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/small_vector.h"
                  ,0x69,
                  "SmallVector<T, small_size> &spvtools::utils::SmallVector<unsigned int, 2>::operator=(const SmallVector<T, small_size> &) [T = unsigned int, small_size = 2]"
                 );
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&that->large_data_);
  if (bVar1) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->large_data_);
    if (bVar1) {
      pvVar2 = std::
               unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator*(&local_18->large_data_);
      this_00 = std::
                unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator*(&this->large_data_);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(this_00,pvVar2);
    }
    else {
      pvVar2 = std::
               unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator*(&local_18->large_data_);
      MakeUnique<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>&>
                ((spvtools *)&i,pvVar2);
      std::
      unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator=(&this->large_data_,
                  (unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)&i);
      std::
      unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~unique_ptr((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     *)&i);
    }
  }
  else {
    std::
    unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::reset(&this->large_data_,(pointer)0x0);
    local_28 = 0;
    while( true ) {
      bVar1 = false;
      if (local_28 < this->size_) {
        bVar1 = local_28 < local_18->size_;
      }
      if (!bVar1) break;
      this->small_data_[local_28] = local_18->small_data_[local_28];
      local_28 = local_28 + 1;
    }
    if (local_28 < local_18->size_) {
      for (; local_28 < local_18->size_; local_28 = local_28 + 1) {
        this->small_data_[local_28] = local_18->small_data_[local_28];
      }
    }
    else {
      for (; local_28 < this->size_; local_28 = local_28 + 1) {
      }
    }
    this->size_ = local_18->size_;
  }
  return this;
}

Assistant:

SmallVector& operator=(const SmallVector& that) {
    assert(small_data_);
    if (that.large_data_) {
      if (large_data_) {
        *large_data_ = *that.large_data_;
      } else {
        large_data_ = MakeUnique<std::vector<T>>(*that.large_data_);
      }
    } else {
      large_data_.reset(nullptr);
      size_t i = 0;
      // Do a copy for any element in |this| that is already constructed.
      for (; i < size_ && i < that.size_; ++i) {
        small_data_[i] = that.small_data_[i];
      }

      if (i >= that.size_) {
        // If the size of |this| becomes smaller after the assignment, then
        // destroy any extra elements.
        for (; i < size_; ++i) {
          small_data_[i].~T();
        }
      } else {
        // If the size of |this| becomes larger after the assignement, copy
        // construct the new elements that are needed.
        for (; i < that.size_; ++i) {
          new (small_data_ + i) T(that.small_data_[i]);
        }
      }
      size_ = that.size_;
    }
    return *this;
  }